

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O2

void __thiscall crnlib::dynamic_string::translate_lf_to_crlf(dynamic_string *this)

{
  char c;
  undefined4 uVar1;
  undefined4 uVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  uint i;
  ulong uVar6;
  dynamic_string local_40;
  
  iVar4 = find_left(this,'\n');
  if (-1 < iVar4) {
    local_40.m_buf_size = 0;
    local_40.m_len = 0;
    local_40.m_pStr = (char *)0x0;
    ensure_buf(&local_40,this->m_len + 2,true);
    cVar3 = -1;
    for (uVar6 = 0; uVar1 = local_40._0_4_, uVar6 < this->m_len; uVar6 = uVar6 + 1) {
      pcVar5 = this->m_pStr;
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "";
      }
      c = pcVar5[uVar6];
      if (cVar3 != '\r' && c == '\n') {
        append_char(&local_40,'\r');
      }
      append_char(&local_40,c);
      cVar3 = c;
    }
    local_40.m_len = this->m_len;
    local_40.m_buf_size = this->m_buf_size;
    uVar2 = local_40._0_4_;
    local_40.m_buf_size = (uint16)uVar1;
    local_40.m_len = SUB42(uVar1,2);
    this->m_buf_size = local_40.m_buf_size;
    this->m_len = local_40.m_len;
    pcVar5 = this->m_pStr;
    this->m_pStr = local_40.m_pStr;
    local_40._0_4_ = uVar2;
    local_40.m_pStr = pcVar5;
    ~dynamic_string(&local_40);
  }
  return;
}

Assistant:

void dynamic_string::translate_lf_to_crlf()
    {
        if (find_left(0x0A) < 0)
        {
            return;
        }

        dynamic_string tmp;
        tmp.ensure_buf(m_len + 2);

        // normal sequence is 0x0D 0x0A (CR LF, \r\n)

        int prev_char = -1;
        for (uint i = 0; i < get_len(); i++)
        {
            const int cur_char = (*this)[i];

            if ((cur_char == 0x0A) && (prev_char != 0x0D))
            {
                tmp.append_char(0x0D);
            }

            tmp.append_char(cur_char);

            prev_char = cur_char;
        }

        swap(tmp);
    }